

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQChar * sqstd_rex_matchnode(SQRex *exp,SQRexNode *node,SQChar *str,SQRexNode *next)

{
  SQInteger SVar1;
  int iVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  SQChar *str_00;
  SQChar *pSVar5;
  SQBool SVar6;
  SQRexNode *pSVar7;
  bool bVar8;
  SQRex *local_f0;
  SQRex *local_e8;
  SQChar *streol;
  SQInteger cont;
  SQInteger ce;
  SQInteger cb;
  SQRexNode *subnext;
  SQInteger tempcap;
  SQInteger capture;
  SQChar *cur;
  SQRexNode *n;
  SQRexNode *temp;
  SQChar *asd;
  SQRexNode *gnext;
  SQChar *stop;
  SQChar *good;
  SQChar *s;
  SQInteger nmaches;
  SQInteger p1;
  SQInteger p0;
  SQRexNode *greedystop;
  SQRexNodeType type;
  SQRexNode *next_local;
  SQChar *str_local;
  SQRexNode *node_local;
  SQRex *exp_local;
  
  iVar2 = node->type;
  exp_local = (SQRex *)str;
  switch(iVar2) {
  case 0x100:
    pSVar3 = (SQChar *)(node->right >> 0x10 & 0xffff);
    pSVar4 = (SQChar *)(node->right & 0xffff);
    s = (SQChar *)0x0;
    good = str;
    p0 = (SQInteger)next;
    if (node->next != -1) {
      p0 = (SQInteger)(exp->_nodes + node->next);
      good = str;
    }
    do {
      stop = good;
      if ((s != (SQChar *)0xffff && (long)pSVar4 <= (long)s) ||
         (str_00 = sqstd_rex_matchnode(exp,exp->_nodes + node->left,good,(SQRexNode *)p0),
         stop = good, str_00 == (SQChar *)0x0)) break;
      s = s + 1;
      stop = str_00;
      if ((p0 != 0) &&
         ((*(int *)p0 != 0x100 ||
          ((*(int *)p0 == 0x100 && ((*(long *)(p0 + 0x10) >> 0x10 & 0xffffU) != 0)))))) {
        asd = (SQChar *)0x0;
        if (*(long *)(p0 + 0x18) == -1) {
          if ((next != (SQRexNode *)0x0) && (next->next != -1)) {
            asd = (SQChar *)(exp->_nodes + next->next);
          }
        }
        else {
          asd = (SQChar *)(exp->_nodes + *(long *)(p0 + 0x18));
        }
        pSVar5 = sqstd_rex_matchnode(exp,(SQRexNode *)p0,str_00,(SQRexNode *)asd);
        if ((pSVar5 != (SQChar *)0x0) &&
           ((((pSVar3 == pSVar4 && (pSVar3 == s)) ||
             (((long)pSVar3 <= (long)s && (pSVar4 == (SQChar *)0xffff)))) ||
            (((long)pSVar3 <= (long)s && ((long)s <= (long)pSVar4)))))) break;
      }
      good = str_00;
    } while (str_00 < exp->_eol);
    if ((pSVar3 == pSVar4) && (pSVar3 == s)) {
      exp_local = (SQRex *)stop;
    }
    else if (((long)s < (long)pSVar3) || (pSVar4 != (SQChar *)0xffff)) {
      if (((long)s < (long)pSVar3) || ((long)pSVar4 < (long)s)) {
        exp_local = (SQRex *)0x0;
      }
      else {
        exp_local = (SQRex *)stop;
      }
    }
    else {
      exp_local = (SQRex *)stop;
    }
    break;
  case 0x101:
    n = exp->_nodes + node->left;
    temp = (SQRexNode *)str;
    while (temp = (SQRexNode *)sqstd_rex_matchnode(exp,n,(SQChar *)temp,(SQRexNode *)0x0),
          temp != (SQRexNode *)0x0) {
      if (n->next == -1) {
        return (SQChar *)temp;
      }
      n = exp->_nodes + n->next;
    }
    n = exp->_nodes + node->right;
    temp = (SQRexNode *)str;
    while (temp = (SQRexNode *)sqstd_rex_matchnode(exp,n,(SQChar *)temp,(SQRexNode *)0x0),
          temp != (SQRexNode *)0x0) {
      if (n->next == -1) {
        return (SQChar *)temp;
      }
      n = exp->_nodes + n->next;
    }
    exp_local = (SQRex *)0x0;
    break;
  case 0x102:
  case 0x103:
    cur = (SQChar *)(exp->_nodes + node->left);
    tempcap = -1;
    if ((node->type != 0x103) && (node->right == exp->_currsubexp)) {
      tempcap = exp->_currsubexp;
      exp->_matches[tempcap].begin = str;
      exp->_currsubexp = exp->_currsubexp + 1;
    }
    SVar1 = exp->_currsubexp;
    capture = (SQInteger)str;
    do {
      cb = (SQInteger)next;
      if (*(long *)(cur + 0x18) != -1) {
        cb = (SQInteger)(exp->_nodes + *(long *)(cur + 0x18));
      }
      capture = (SQInteger)
                sqstd_rex_matchnode(exp,(SQRexNode *)cur,(SQChar *)capture,(SQRexNode *)cb);
      if ((SQRex *)capture == (SQRex *)0x0) {
        if (tempcap != -1) {
          exp->_matches[tempcap].begin = (SQChar *)0x0;
          exp->_matches[tempcap].len = 0;
        }
        return (SQChar *)0x0;
      }
      bVar8 = false;
      if (*(long *)(cur + 0x18) != -1) {
        cur = (SQChar *)(exp->_nodes + *(long *)(cur + 0x18));
        bVar8 = (SQRexNode *)cur != (SQRexNode *)0x0;
      }
    } while (bVar8);
    exp->_currsubexp = SVar1;
    exp_local = (SQRex *)capture;
    if (tempcap != -1) {
      exp->_matches[tempcap].len = capture - (long)exp->_matches[tempcap].begin;
    }
    break;
  case 0x104:
    if (str == exp->_eol) {
      exp_local = (SQRex *)0x0;
    }
    else {
      exp_local = (SQRex *)(str + 1);
    }
    break;
  case 0x105:
  case 0x107:
    if (str == exp->_eol) {
      exp_local = (SQRex *)0x0;
    }
    else {
      SVar6 = sqstd_rex_matchclass(exp,exp->_nodes + node->left,*str);
      if (SVar6 == 0) {
        bVar8 = iVar2 == 0x107;
      }
      else {
        bVar8 = iVar2 == 0x105;
      }
      if (bVar8) {
        exp_local = (SQRex *)(str + 1);
      }
      else {
        exp_local = (SQRex *)0x0;
      }
    }
    break;
  case 0x106:
    if (str == exp->_eol) {
      exp_local = (SQRex *)0x0;
    }
    else {
      SVar6 = sqstd_rex_matchcclass(node->left,*str);
      if (SVar6 == 0) {
        exp_local = (SQRex *)0x0;
      }
      else {
        exp_local = (SQRex *)(str + 1);
      }
    }
    break;
  default:
    if (str == exp->_eol) {
      exp_local = (SQRex *)0x0;
    }
    else if ((int)*str == node->type) {
      exp_local = (SQRex *)(str + 1);
    }
    else {
      exp_local = (SQRex *)0x0;
    }
    break;
  case 0x10a:
    if (str != exp->_eol) {
      exp_local = (SQRex *)0x0;
    }
    break;
  case 0x10b:
    if (str != exp->_bol) {
      exp_local = (SQRex *)0x0;
    }
    break;
  case 0x10c:
    if (((((str == exp->_bol) && (iVar2 = isspace((int)*str), iVar2 == 0)) ||
         ((str == exp->_eol && (iVar2 = isspace((int)str[-1]), iVar2 == 0)))) ||
        ((iVar2 = isspace((int)*str), iVar2 == 0 && (iVar2 = isspace((int)str[1]), iVar2 != 0)))) ||
       ((iVar2 = isspace((int)*str), iVar2 != 0 && (iVar2 = isspace((int)str[1]), iVar2 == 0)))) {
      local_e8 = (SQRex *)str;
      if (node->left != 0x62) {
        local_e8 = (SQRex *)0x0;
      }
      exp_local = local_e8;
    }
    else {
      local_f0 = (SQRex *)str;
      if (node->left == 0x62) {
        local_f0 = (SQRex *)0x0;
      }
      exp_local = local_f0;
    }
    break;
  case 0x10d:
    if ((long)*str == node->left) {
      streol = (SQChar *)0x1;
      pSVar7 = (SQRexNode *)str;
      do {
        while( true ) {
          next_local = pSVar7;
          pSVar7 = (SQRexNode *)((long)&next_local->type + 1);
          if ((SQRexNode *)exp->_eol <= pSVar7) {
            return (SQChar *)0x0;
          }
          if ((long)(char)pSVar7->type == node->right) break;
          if ((long)(char)pSVar7->type == node->left) {
            streol = streol + 1;
          }
        }
        streol = streol + -1;
      } while (streol != (SQChar *)0x0);
      exp_local = (SQRex *)((long)&next_local->type + 2);
    }
    else {
      exp_local = (SQRex *)0x0;
    }
  }
  return (SQChar *)exp_local;
}

Assistant:

static const SQChar *sqstd_rex_matchnode(SQRex* exp,SQRexNode *node,const SQChar *str,SQRexNode *next)
{

    SQRexNodeType type = node->type;
    switch(type) {
    case OP_GREEDY: {
        //SQRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
        SQRexNode *greedystop = NULL;
        SQInteger p0 = (node->right >> 16)&0x0000FFFF, p1 = node->right&0x0000FFFF, nmaches = 0;
        const SQChar *s=str, *good = str;

        if(node->next != -1) {
            greedystop = &exp->_nodes[node->next];
        }
        else {
            greedystop = next;
        }

        while((nmaches == 0xFFFF || nmaches < p1)) {

            const SQChar *stop;
            if(!(s = sqstd_rex_matchnode(exp,&exp->_nodes[node->left],s,greedystop)))
                break;
            nmaches++;
            good=s;
            if(greedystop) {
                //checks that 0 matches satisfy the expression(if so skips)
                //if not would always stop(for instance if is a '?')
                if(greedystop->type != OP_GREEDY ||
                (greedystop->type == OP_GREEDY && ((greedystop->right >> 16)&0x0000FFFF) != 0))
                {
                    SQRexNode *gnext = NULL;
                    if(greedystop->next != -1) {
                        gnext = &exp->_nodes[greedystop->next];
                    }else if(next && next->next != -1){
                        gnext = &exp->_nodes[next->next];
                    }
                    stop = sqstd_rex_matchnode(exp,greedystop,s,gnext);
                    if(stop) {
                        //if satisfied stop it
                        if(p0 == p1 && p0 == nmaches) break;
                        else if(nmaches >= p0 && p1 == 0xFFFF) break;
                        else if(nmaches >= p0 && nmaches <= p1) break;
                    }
                }
            }

            if(s >= exp->_eol)
                break;
        }
        if(p0 == p1 && p0 == nmaches) return good;
        else if(nmaches >= p0 && p1 == 0xFFFF) return good;
        else if(nmaches >= p0 && nmaches <= p1) return good;
        return NULL;
    }
    case OP_OR: {
            const SQChar *asd = str;
            SQRexNode *temp=&exp->_nodes[node->left];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            asd = str;
            temp = &exp->_nodes[node->right];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            return NULL;
            break;
    }
    case OP_EXPR:
    case OP_NOCAPEXPR:{
            SQRexNode *n = &exp->_nodes[node->left];
            const SQChar *cur = str;
            SQInteger capture = -1;
            if(node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
                capture = exp->_currsubexp;
                exp->_matches[capture].begin = cur;
                exp->_currsubexp++;
            }
            SQInteger tempcap = exp->_currsubexp;
            do {
                SQRexNode *subnext = NULL;
                if(n->next != -1) {
                    subnext = &exp->_nodes[n->next];
                }else {
                    subnext = next;
                }
                if(!(cur = sqstd_rex_matchnode(exp,n,cur,subnext))) {
                    if(capture != -1){
                        exp->_matches[capture].begin = 0;
                        exp->_matches[capture].len = 0;
                    }
                    return NULL;
                }
            } while((n->next != -1) && (n = &exp->_nodes[n->next]));

            exp->_currsubexp = tempcap;
            if(capture != -1)
                exp->_matches[capture].len = cur - exp->_matches[capture].begin;
            return cur;
    }
    case OP_WB:
        if((str == exp->_bol && !isspace(*str))
         || (str == exp->_eol && !isspace(*(str-1)))
         || (!isspace(*str) && isspace(*(str+1)))
         || (isspace(*str) && !isspace(*(str+1))) ) {
            return (node->left == 'b')?str:NULL;
        }
        return (node->left == 'b')?NULL:str;
    case OP_BOL:
        if(str == exp->_bol) return str;
        return NULL;
    case OP_EOL:
        if(str == exp->_eol) return str;
        return NULL;
    case OP_DOT:{
        if (str == exp->_eol) return NULL;
        str++;
                }
        return str;
    case OP_NCLASS:
    case OP_CLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchclass(exp,&exp->_nodes[node->left],*str)?(type == OP_CLASS?SQTrue:SQFalse):(type == OP_NCLASS?SQTrue:SQFalse)) {
            str++;
            return str;
        }
        return NULL;
    case OP_CCLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchcclass(node->left,*str)) {
            str++;
            return str;
        }
        return NULL;
    case OP_MB:
        {
            SQInteger cb = node->left; //char that opens a balanced expression
            if(*str != cb) return NULL; // string doesnt start with open char
            SQInteger ce = node->right; //char that closes a balanced expression
            SQInteger cont = 1;
            const SQChar *streol = exp->_eol;
            while (++str < streol) {
              if (*str == ce) {
                if (--cont == 0) {
                    return ++str;
                }
              }
              else if (*str == cb) cont++;
            }
        }
        return NULL; // string ends out of balance
    default: /* char */
        if (str == exp->_eol) return NULL;
        if(*str != node->type) return NULL;
        str++;
        return str;
    }
    return NULL;
}